

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImGuiWindow * FindWindowNavFocusable(int i_start,int i_stop,int dir)

{
  bool bVar1;
  ImGuiWindow **ppIVar2;
  int i;
  ImVector<ImGuiWindow_*> *this;
  
  this = &GImGui->WindowsFocusOrder;
  while( true ) {
    if (i_start < 0) {
      return (ImGuiWindow *)0x0;
    }
    if (i_stop == i_start) {
      return (ImGuiWindow *)0x0;
    }
    if (this->Size <= i_start) {
      return (ImGuiWindow *)0x0;
    }
    ppIVar2 = ImVector<ImGuiWindow_*>::operator[](this,i_start);
    bVar1 = ImGui::IsWindowNavFocusable(*ppIVar2);
    if (bVar1) break;
    i_start = i_start + dir;
  }
  ppIVar2 = ImVector<ImGuiWindow_*>::operator[](this,i_start);
  return *ppIVar2;
}

Assistant:

static ImGuiWindow* FindWindowNavFocusable(int i_start, int i_stop, int dir) // FIXME-OPT O(N)
{
    ImGuiContext& g = *GImGui;
    for (int i = i_start; i >= 0 && i < g.WindowsFocusOrder.Size && i != i_stop; i += dir)
        if (ImGui::IsWindowNavFocusable(g.WindowsFocusOrder[i]))
            return g.WindowsFocusOrder[i];
    return NULL;
}